

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::PushColumnClipRect(int column_index)

{
  undefined1 unaff_retaddr;
  ImGuiColumnData *column;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  int in_stack_ffffffffffffffdc;
  ImVector<ImGuiColumnData> *in_stack_ffffffffffffffe0;
  
  GetCurrentWindowRead();
  ImVector<ImGuiColumnData>::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  PushClipRect((ImVec2 *)columns,(ImVec2 *)column,(bool)unaff_retaddr);
  return;
}

Assistant:

void ImGui::PushColumnClipRect(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (column_index < 0)
        column_index = columns->Current;

    ImGuiColumnData* column = &columns->Columns[column_index];
    PushClipRect(column->ClipRect.Min, column->ClipRect.Max, false);
}